

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O2

void __thiscall
agge::tests::QuadraticBezierCurveTests::CoarseQBezier2ProducesLine(QuadraticBezierCurveTests *this)

{
  allocator local_159;
  point local_158;
  point local_14c;
  point local_140;
  LocationInfo local_130;
  point local_108;
  undefined8 local_fc;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined4 local_e8;
  point local_d8;
  undefined8 local_cc;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined4 local_b8;
  point local_a8;
  point local_9c;
  point local_90;
  qbezier b2;
  string local_50;
  qbezier b1;
  
  qbezier::qbezier(&b1,0.0,0.0,1.0,1.0,2.0,0.0,100.0);
  local_a8 = vertex<agge::qbezier>(&b1);
  local_9c = vertex<agge::qbezier>(&b1);
  local_90 = vertex<agge::qbezier>(&b1);
  local_d8.x = 0.0;
  local_d8.y = 0.0;
  local_d8.command = 1;
  local_cc = 0x40000000;
  local_c4 = 2;
  local_c0 = 0;
  local_b8 = 0;
  std::__cxx11::string::string
            ((string *)&b2,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,(allocator *)&local_158);
  ut::LocationInfo::LocationInfo(&local_130,(string *)&b2,0x2e);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,3ul>
            ((point (*) [3])&local_d8,(point (*) [3])&local_a8,&local_130);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  qbezier::qbezier(&b2,10.0,11.0,1.0,1.0,13.0,17.0,100.0);
  local_158 = vertex<agge::qbezier>(&b2);
  local_14c = vertex<agge::qbezier>(&b2);
  local_140 = vertex<agge::qbezier>(&b2);
  local_108.x = 10.0;
  local_108.y = 11.0;
  local_108.command = 1;
  local_fc = 0x4188000041500000;
  local_f4 = 2;
  local_f0 = 0;
  local_e8 = 0;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_159);
  ut::LocationInfo::LocationInfo(&local_130,&local_50,0x39);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,3ul>
            ((point (*) [3])&local_108,(point (*) [3])&local_158,&local_130);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( CoarseQBezier2ProducesLine )
			{
				// INIT
				qbezier b1(0.0f, 0.0f, 1.0f, 1.0f, 2.0f, 0.0f, 100.0f /* ridiculously big step */);

				// ACT
				mocks::path::point points1[] = { vertex(b1), vertex(b1), vertex(b1), };

				// ASSERT
				mocks::path::point reference1[] = { moveto(0.0f, 0.0f), lineto(2.0f, 0.0f), stop(), };

				assert_equal(reference1, points1);

				// INIT
				qbezier b2(10.0f, 11.0f, 1.0f, 1.0f, 13.0f, 17.0f, 100.0f /* ridiculously big step */);

				// ACT
				mocks::path::point points2[] = { vertex(b2), vertex(b2), vertex(b2), };

				// ASSERT
				mocks::path::point reference2[] = { moveto(10.0f, 11.0f), lineto(13.0f, 17.0f), stop(), };

				assert_equal(reference2, points2);
			}